

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O2

bool __thiscall CGroupSubSys::parse(CGroupSubSys *this,string *line)

{
  int iVar1;
  long lVar2;
  long lVar3;
  size_t sVar4;
  ulong uVar5;
  bool bVar6;
  char *__s;
  StringPiece input;
  vector<StringPiece,_std::allocator<StringPiece>_> pieces;
  string local_48;
  
  bVar6 = false;
  lVar2 = std::__cxx11::string::find((char)line,0x3a);
  if (lVar2 != -1) {
    (line->_M_dataplus)._M_p[lVar2] = '\0';
    lVar3 = std::__cxx11::string::find((char)line,0x3a);
    if (lVar3 == -1) {
      bVar6 = false;
    }
    else {
      (line->_M_dataplus)._M_p[lVar3] = '\0';
      iVar1 = atoi((line->_M_dataplus)._M_p);
      this->id = iVar1;
      std::__cxx11::string::substr((ulong)&local_48,(ulong)line);
      std::__cxx11::string::operator=((string *)&this->name,(string *)&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      __s = (line->_M_dataplus)._M_p + lVar2 + 1;
      sVar4 = strlen(__s);
      input.len_ = sVar4;
      input.str_ = __s;
      SplitStringPiece(&pieces,input,',');
      lVar2 = 0;
      for (uVar5 = 0;
          uVar5 < (ulong)((long)pieces.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)pieces.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4); uVar5 = uVar5 + 1)
      {
        StringPiece::AsString_abi_cxx11_
                  (&local_48,
                   (StringPiece *)
                   ((long)&(pieces.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                            _M_impl.super__Vector_impl_data._M_start)->str_ + lVar2));
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &this->subsystems,&local_48);
        std::__cxx11::string::~string((string *)&local_48);
        lVar2 = lVar2 + 0x10;
      }
      std::_Vector_base<StringPiece,_std::allocator<StringPiece>_>::~_Vector_base
                (&pieces.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>);
      bVar6 = true;
    }
  }
  return bVar6;
}

Assistant:

bool parse(string& line) {
    size_t first = line.find(':');
    if (first == string::npos)
      return false;
    line[first] = '\0';
    size_t second = line.find(':', first + 1);
    if (second == string::npos)
      return false;
    line[second] = '\0';
    id = atoi(line.c_str());
    name = line.substr(second + 1);
    vector<StringPiece> pieces =
        SplitStringPiece(StringPiece(line.c_str() + first + 1), ',');
    for (size_t i = 0; i < pieces.size(); i++) {
      subsystems.push_back(pieces[i].AsString());
    }
    return true;
  }